

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O2

websocket_packet_info_s websocket_buffer_peek(void *buffer,uint64_t len)

{
  byte bVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  ulong uVar5;
  websocket_packet_info_s wVar6;
  websocket_packet_info_s wVar7;
  websocket_packet_info_s wVar8;
  
  if (len < 2) {
    uVar5 = 2;
  }
  else {
    bVar1 = *(byte *)((long)buffer + 1) >> 7;
    lVar4 = (ulong)bVar1 * 4;
    uVar3 = *(byte *)((long)buffer + 1) & 0x7f;
    wVar6.packet_length = (ulong)uVar3;
    if (uVar3 == 0x7f) {
      if (9 < len) {
        if (*(byte *)((long)buffer + 2) < 0x40) {
          wVar8.packet_length =
               (ulong)*(byte *)((long)buffer + 9) |
               (ulong)*(byte *)((long)buffer + 7) << 0x10 |
               (ulong)*(byte *)((long)buffer + 6) << 0x18 |
               (ulong)*(byte *)((long)buffer + 5) << 0x20 |
               (ulong)*(byte *)((long)buffer + 4) << 0x28 |
               (ulong)*(byte *)((long)buffer + 3) << 0x30 |
               (ulong)*(byte *)((long)buffer + 2) << 0x38 | (ulong)*(byte *)((long)buffer + 8) << 8;
          wVar8._8_8_ = lVar4 + (ulong)bVar1 * 0x100 + 10;
          return wVar8;
        }
        return (websocket_packet_info_s)ZEXT816(0);
      }
      uVar5 = (ulong)bVar1 * 0x100 + lVar4 + 10;
    }
    else {
      if (uVar3 != 0x7e) {
        wVar6._8_8_ = lVar4 + (ulong)bVar1 * 0x100 + 2;
        return wVar6;
      }
      if (3 < len) {
        wVar7.packet_length =
             (ulong)(ushort)(*(ushort *)((long)buffer + 2) << 8 | *(ushort *)((long)buffer + 2) >> 8
                            );
        wVar7._8_8_ = lVar4 + (ulong)bVar1 * 0x100 + 4;
        return wVar7;
      }
      uVar5 = lVar4 + (ulong)bVar1 * 0x100 + 4;
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  return (websocket_packet_info_s)(auVar2 << 0x40);
}

Assistant:

inline static struct websocket_packet_info_s
websocket_buffer_peek(void *buffer, uint64_t len) {
  if (len < 2) {
    const struct websocket_packet_info_s info = {0 /* packet */, 2 /* head */,
                                                 0 /* masked? */};
    return info;
  }
  const uint8_t mask_f = (((uint8_t *)buffer)[1] >> 7) & 1;
  const uint8_t mask_l = (mask_f << 2);
  uint8_t len_indicator = ((((uint8_t *)buffer)[1]) & 127);
  switch (len_indicator) {
  case 126:
    if (len < 4)
      return (struct websocket_packet_info_s){0, (uint8_t)(4 + mask_l), mask_f};
    return (struct websocket_packet_info_s){
        (uint64_t)websocket_str2u16(((uint8_t *)buffer + 2)),
        (uint8_t)(4 + mask_l), mask_f};
  case 127:
    if (len < 10)
      return (struct websocket_packet_info_s){0, (uint8_t)(10 + mask_l),
                                              mask_f};
    {
      uint64_t msg_len = websocket_str2u64(((uint8_t *)buffer + 2));
      if (msg_len >> 62)
        return (struct websocket_packet_info_s){0, 0, 0};
      return (struct websocket_packet_info_s){msg_len, (uint8_t)(10 + mask_l),
                                              mask_f};
    }
  default:
    return (struct websocket_packet_info_s){len_indicator,
                                            (uint8_t)(2 + mask_l), mask_f};
  }
}